

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3FkRequired(Parse *pParse,Table *pTab,int *aChange,int chngRowid)

{
  long lVar1;
  char *zRight;
  uint uVar2;
  int iVar3;
  FKey *pFVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  FKey **ppFVar8;
  long lVar9;
  ulong uVar10;
  
  uVar2 = 0;
  if ((pParse->db->flags & 0x40000) != 0) {
    if (aChange == (int *)0x0) {
      pFVar4 = sqlite3FkReferences(pTab);
      if (pFVar4 == (FKey *)0x0) {
        uVar2 = (uint)(pTab->pFKey != (FKey *)0x0);
      }
      else {
LAB_0015f17c:
        uVar2 = 1;
      }
    }
    else {
      ppFVar8 = &pTab->pFKey;
      while (pFVar4 = *ppFVar8, pFVar4 != (FKey *)0x0) {
        uVar2 = pFVar4->nCol;
        if (pFVar4->nCol < 1) {
          uVar2 = 0;
        }
        lVar9 = 0;
        while (lVar1 = lVar9 + 0x10, (ulong)uVar2 * 0x10 + 0x10 != lVar1) {
          iVar3 = *(int *)((long)&pFVar4->aCol[0].iFrom + lVar9);
          if (-1 < aChange[iVar3]) {
            return 1;
          }
          lVar9 = lVar1;
          if ((chngRowid != 0) && (iVar3 == pTab->iPKey)) {
            return 1;
          }
        }
        ppFVar8 = &pFVar4->pNextFrom;
      }
      for (pFVar4 = sqlite3FkReferences(pTab); pFVar4 != (FKey *)0x0; pFVar4 = pFVar4->pNextTo) {
        uVar5 = (ulong)(uint)pFVar4->nCol;
        if (pFVar4->nCol < 1) {
          uVar5 = 0;
        }
        for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
          uVar6 = (ulong)(ushort)pTab->nCol;
          if (pTab->nCol < 1) {
            uVar6 = 0;
          }
          zRight = pFVar4->aCol[uVar7].zCol;
          lVar9 = 0;
          for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
            if (zRight == (char *)0x0) {
              if ((*(byte *)((long)&pTab->aCol->colFlags + lVar9) & 1) != 0) goto LAB_0015f22b;
            }
            else {
              iVar3 = sqlite3_stricmp(*(char **)((long)&pTab->aCol->zName + lVar9),zRight);
              if (iVar3 == 0) {
LAB_0015f22b:
                if ((-1 < aChange[uVar10]) ||
                   ((chngRowid != 0 && (uVar10 == (uint)(int)pTab->iPKey)))) goto LAB_0015f17c;
              }
            }
            lVar9 = lVar9 + 0x30;
          }
        }
      }
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3FkRequired(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being modified */
  int *aChange,                   /* Non-NULL for UPDATE operations */
  int chngRowid                   /* True for UPDATE that affects rowid */
){
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    if( !aChange ){
      /* A DELETE operation. Foreign key processing is required if the 
      ** table in question is either the child or parent table for any 
      ** foreign key constraint.  */
      return (sqlite3FkReferences(pTab) || pTab->pFKey);
    }else{
      /* This is an UPDATE. Foreign key processing is only required if the
      ** operation modifies one or more child or parent key columns. */
      int i;
      FKey *p;

      /* Check if any child key columns are being modified. */
      for(p=pTab->pFKey; p; p=p->pNextFrom){
        for(i=0; i<p->nCol; i++){
          int iChildKey = p->aCol[i].iFrom;
          if( aChange[iChildKey]>=0 ) return 1;
          if( iChildKey==pTab->iPKey && chngRowid ) return 1;
        }
      }

      /* Check if any parent key columns are being modified. */
      for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
        for(i=0; i<p->nCol; i++){
          char *zKey = p->aCol[i].zCol;
          int iKey;
          for(iKey=0; iKey<pTab->nCol; iKey++){
            Column *pCol = &pTab->aCol[iKey];
            if( (zKey ? !sqlite3StrICmp(pCol->zName, zKey)
                      : (pCol->colFlags & COLFLAG_PRIMKEY)!=0) ){
              if( aChange[iKey]>=0 ) return 1;
              if( iKey==pTab->iPKey && chngRowid ) return 1;
            }
          }
        }
      }
    }
  }
  return 0;
}